

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void highbd_filter_intra_predictor
               (uint16_t *dst,ptrdiff_t stride,TX_SIZE tx_size,uint16_t *above,uint16_t *left,
               int mode,int bd)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  uint16_t uVar10;
  long in_RCX;
  byte in_DL;
  long in_RSI;
  void *in_RDI;
  long in_R8;
  int in_R9D;
  int pr;
  int c_offset;
  int r_offset;
  int k;
  uint16_t p6;
  uint16_t p5;
  uint16_t p4;
  uint16_t p3;
  uint16_t p2;
  uint16_t p1;
  uint16_t p0;
  int bh;
  int bw;
  uint16_t buffer [33] [33];
  int c;
  int r;
  int in_stack_fffffffffffff71c;
  uint local_8d4;
  ushort local_8b8;
  undefined1 local_8b6 [2178];
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  long local_20;
  long local_10;
  void *local_8;
  
  iVar8 = tx_size_wide[in_DL];
  iVar9 = tx_size_high[in_DL];
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < iVar9; local_30 = local_30 + 1) {
    (&local_8b8)[(long)(local_30 + 1) * 0x21] = *(ushort *)(local_28 + (long)local_30 * 2);
  }
  memcpy(&local_8b8,(void *)(local_20 + -2),(long)(iVar8 + 1) << 1);
  for (local_30 = 1; local_30 < iVar9 + 1; local_30 = local_30 + 2) {
    for (local_34 = 1; local_34 < iVar8 + 1; local_34 = local_34 + 4) {
      uVar1 = (&local_8b8)[(long)(local_30 + -1) * 0x21 + (long)(local_34 + -1)];
      uVar2 = (&local_8b8)[(long)(local_30 + -1) * 0x21 + (long)local_34];
      uVar3 = (&local_8b8)[(long)(local_30 + -1) * 0x21 + (long)(local_34 + 1)];
      uVar4 = (&local_8b8)[(long)(local_30 + -1) * 0x21 + (long)(local_34 + 2)];
      uVar5 = (&local_8b8)[(long)(local_30 + -1) * 0x21 + (long)(local_34 + 3)];
      uVar6 = (&local_8b8)[(long)local_30 * 0x21 + (long)(local_34 + -1)];
      uVar7 = (&local_8b8)[(long)(local_30 + 1) * 0x21 + (long)(local_34 + -1)];
      for (local_8d4 = 0; (int)local_8d4 < 8; local_8d4 = local_8d4 + 1) {
        uVar10 = clip_pixel_highbd((int)av1_filter_intra_taps[local_2c][(int)local_8d4][0] *
                                   (uint)uVar1 +
                                   (int)*(char *)((long)local_2c * 0x40 + 0xc08021 +
                                                 (long)(int)local_8d4 * 8) * (uint)uVar2 +
                                   (int)*(char *)((long)local_2c * 0x40 + 0xc08022 +
                                                 (long)(int)local_8d4 * 8) * (uint)uVar3 +
                                   (int)*(char *)((long)local_2c * 0x40 + 0xc08023 +
                                                 (long)(int)local_8d4 * 8) * (uint)uVar4 +
                                   (int)*(char *)((long)local_2c * 0x40 + 0xc08024 +
                                                 (long)(int)local_8d4 * 8) * (uint)uVar5 +
                                   (int)*(char *)((long)local_2c * 0x40 + 0xc08025 +
                                                 (long)(int)local_8d4 * 8) * (uint)uVar6 +
                                   (int)*(char *)((long)local_2c * 0x40 + 0xc08026 +
                                                 (long)(int)local_8d4 * 8) * (uint)uVar7,
                                   in_stack_fffffffffffff71c);
        (&local_8b8)
        [(long)(local_30 + ((int)local_8d4 >> 2)) * 0x21 + (long)(int)(local_34 + (local_8d4 & 3))]
             = uVar10;
      }
    }
  }
  for (local_30 = 0; local_30 < iVar9; local_30 = local_30 + 1) {
    memcpy(local_8,local_8b6 + (long)(local_30 + 1) * 0x42,(long)iVar8 << 1);
    local_8 = (void *)(local_10 * 2 + (long)local_8);
  }
  return;
}

Assistant:

static void highbd_filter_intra_predictor(uint16_t *dst, ptrdiff_t stride,
                                          TX_SIZE tx_size,
                                          const uint16_t *above,
                                          const uint16_t *left, int mode,
                                          int bd) {
  int r, c;
  uint16_t buffer[33][33];
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];

  assert(bw <= 32 && bh <= 32);

  for (r = 0; r < bh; ++r) buffer[r + 1][0] = left[r];
  memcpy(buffer[0], &above[-1], (bw + 1) * sizeof(buffer[0][0]));

  for (r = 1; r < bh + 1; r += 2)
    for (c = 1; c < bw + 1; c += 4) {
      const uint16_t p0 = buffer[r - 1][c - 1];
      const uint16_t p1 = buffer[r - 1][c];
      const uint16_t p2 = buffer[r - 1][c + 1];
      const uint16_t p3 = buffer[r - 1][c + 2];
      const uint16_t p4 = buffer[r - 1][c + 3];
      const uint16_t p5 = buffer[r][c - 1];
      const uint16_t p6 = buffer[r + 1][c - 1];
      for (int k = 0; k < 8; ++k) {
        int r_offset = k >> 2;
        int c_offset = k & 0x03;
        int pr = av1_filter_intra_taps[mode][k][0] * p0 +
                 av1_filter_intra_taps[mode][k][1] * p1 +
                 av1_filter_intra_taps[mode][k][2] * p2 +
                 av1_filter_intra_taps[mode][k][3] * p3 +
                 av1_filter_intra_taps[mode][k][4] * p4 +
                 av1_filter_intra_taps[mode][k][5] * p5 +
                 av1_filter_intra_taps[mode][k][6] * p6;
        // Section 7.11.2.3 specifies the right-hand side of the assignment as
        //   Clip1( Round2Signed( pr, INTRA_FILTER_SCALE_BITS ) ).
        // Since Clip1() clips a negative value to 0, it is safe to replace
        // Round2Signed() with Round2().
        buffer[r + r_offset][c + c_offset] = clip_pixel_highbd(
            ROUND_POWER_OF_TWO(pr, FILTER_INTRA_SCALE_BITS), bd);
      }
    }

  for (r = 0; r < bh; ++r) {
    memcpy(dst, &buffer[r + 1][1], bw * sizeof(dst[0]));
    dst += stride;
  }
}